

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O0

void SampleMuxerMetadata::WriteCueSettings(settings_t *settings,string *pf)

{
  bool bVar1;
  char cVar2;
  _List_const_iterator<libwebvtt::Setting> local_38;
  reference local_30;
  Setting *setting;
  iter_t j;
  iter_t i;
  string *pf_local;
  settings_t *settings_local;
  
  bVar1 = std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::empty
                    (settings);
  cVar2 = (char)pf;
  if (bVar1) {
    std::__cxx11::string::push_back(cVar2);
  }
  else {
    j._M_node = (_List_node_base *)
                std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::begin
                          (settings);
    setting = (Setting *)
              std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::end
                        (settings);
    while( true ) {
      local_38._M_node =
           (_List_node_base *)std::_List_const_iterator<libwebvtt::Setting>::operator++(&j,0);
      local_30 = std::_List_const_iterator<libwebvtt::Setting>::operator*(&local_38);
      std::__cxx11::string::append((string *)pf);
      std::__cxx11::string::push_back(cVar2);
      std::__cxx11::string::append((string *)pf);
      bVar1 = std::operator==(&j,(_Self *)&setting);
      if (bVar1) break;
      std::__cxx11::string::push_back(cVar2);
    }
    std::__cxx11::string::push_back(cVar2);
  }
  return;
}

Assistant:

void SampleMuxerMetadata::WriteCueSettings(const cue_t::settings_t& settings,
                                           std::string* pf) {
  if (settings.empty()) {
    pf->push_back('\x0A');  // LF
    return;
  }

  typedef cue_t::settings_t::const_iterator iter_t;

  iter_t i = settings.begin();
  const iter_t j = settings.end();

  for (;;) {
    const libwebvtt::Setting& setting = *i++;

    pf->append(setting.name);
    pf->push_back(':');
    pf->append(setting.value);

    if (i == j)
      break;

    pf->push_back(' ');  // separate settings with whitespace
  }

  pf->push_back('\x0A');  // LF
}